

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O3

void __thiscall QPDFAcroFormDocumentHelper::Members::Members(Members *this)

{
  _Rb_tree_header *p_Var1;
  
  this->cache_valid = false;
  p_Var1 = &(this->field_to_annotations)._M_t._M_impl.super__Rb_tree_header;
  (this->field_to_annotations)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->field_to_annotations)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->field_to_annotations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->field_to_annotations)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->field_to_annotations)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->annotation_to_field)._M_t._M_impl.super__Rb_tree_header;
  (this->annotation_to_field)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->annotation_to_field)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->annotation_to_field)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->annotation_to_field)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->annotation_to_field)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->field_to_name)._M_t._M_impl.super__Rb_tree_header;
  (this->field_to_name)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->field_to_name)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->field_to_name)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->field_to_name)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->field_to_name)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->name_to_fields)._M_t._M_impl.super__Rb_tree_header;
  (this->name_to_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->name_to_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->name_to_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->name_to_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->name_to_fields)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

QPDFAcroFormDocumentHelper::Members::Members() :
    cache_valid(false)
{
}